

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O0

void do_holylight(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  CHAR_DATA *in_RDI;
  __type_conflict2 _Var2;
  char *unaff_retaddr;
  CHAR_DATA *in_stack_ffffffffffffffe8;
  ulong uVar3;
  
  bVar1 = is_npc(in_stack_ffffffffffffffe8);
  if (!bVar1) {
    uVar3 = in_RDI->act[0];
    _Var2 = std::pow<int,int>(0,0x5997b2);
    if ((uVar3 & (long)_Var2) == 0) {
      _Var2 = std::pow<int,int>(0,0x599811);
      in_RDI->act[0] = (long)_Var2 | in_RDI->act[0];
      send_to_char(unaff_retaddr,in_RDI);
    }
    else {
      _Var2 = std::pow<int,int>(0,0x5997d3);
      in_RDI->act[0] = ((long)_Var2 ^ 0xffffffffffffffffU) & in_RDI->act[0];
      send_to_char(unaff_retaddr,in_RDI);
    }
  }
  return;
}

Assistant:

void do_holylight(CHAR_DATA *ch, char *argument)
{
	if (is_npc(ch))
		return;

	if (IS_SET(ch->act, PLR_HOLYLIGHT))
	{
		REMOVE_BIT(ch->act, PLR_HOLYLIGHT);
		send_to_char("Holy light mode off.\n\r", ch);
	}
	else
	{
		SET_BIT(ch->act, PLR_HOLYLIGHT);
		send_to_char("Holy light mode on.\n\r", ch);
	}
}